

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.hpp
# Opt level: O2

void __thiscall xercesc_4_0::RegularExpression::cleanUp(RegularExpression *this)

{
  BMPattern *this_00;
  TokenFactory *this_01;
  XMLCh *p;
  
  (*this->fMemoryManager->_vptr_MemoryManager[4])(this->fMemoryManager,this->fPattern);
  p = this->fFixedString;
  (*this->fMemoryManager->_vptr_MemoryManager[4])();
  this_00 = this->fBMPattern;
  if (this_00 != (BMPattern *)0x0) {
    BMPattern::~BMPattern(this_00);
  }
  XMemory::operator_delete((XMemory *)this_00,p);
  this_01 = this->fTokenFactory;
  if (this_01 != (TokenFactory *)0x0) {
    TokenFactory::~TokenFactory(this_01);
  }
  XMemory::operator_delete((XMemory *)this_01,p);
  return;
}

Assistant:

inline void RegularExpression::cleanUp() {

      fMemoryManager->deallocate(fPattern);//delete [] fPattern;
      fMemoryManager->deallocate(fFixedString);//delete [] fFixedString;
      delete fBMPattern;
      delete fTokenFactory;
  }